

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableSymbols.cpp
# Opt level: O2

void __thiscall
slang::ast::ClockVarSymbol::serializeTo(ClockVarSymbol *this,ASTSerializer *serializer)

{
  string_view sVar1;
  string_view name;
  
  VariableSymbol::serializeTo(&this->super_VariableSymbol,serializer);
  sVar1 = ast::toString(this->direction);
  ASTSerializer::write(serializer,9,"direction",sVar1._M_len);
  if (((this->inputSkew).delay != (TimingControl *)0x0) || ((this->inputSkew).edge != None)) {
    sVar1._M_str = "inputSkew";
    sVar1._M_len = 9;
    ASTSerializer::writeProperty(serializer,sVar1);
    ASTSerializer::startObject(serializer);
    ClockingSkew::serializeTo(&this->inputSkew,serializer);
    ASTSerializer::endObject(serializer);
  }
  if (((this->outputSkew).delay == (TimingControl *)0x0) && ((this->outputSkew).edge == None)) {
    return;
  }
  name._M_str = "outputSkew";
  name._M_len = 10;
  ASTSerializer::writeProperty(serializer,name);
  ASTSerializer::startObject(serializer);
  ClockingSkew::serializeTo(&this->outputSkew,serializer);
  ASTSerializer::endObject(serializer);
  return;
}

Assistant:

void ClockVarSymbol::serializeTo(ASTSerializer& serializer) const {
    VariableSymbol::serializeTo(serializer);

    serializer.write("direction", toString(direction));

    if (inputSkew.hasValue()) {
        serializer.writeProperty("inputSkew");
        serializer.startObject();
        inputSkew.serializeTo(serializer);
        serializer.endObject();
    }

    if (outputSkew.hasValue()) {
        serializer.writeProperty("outputSkew");
        serializer.startObject();
        outputSkew.serializeTo(serializer);
        serializer.endObject();
    }
}